

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

value * __thiscall
mjs::anon_unknown_46::json_walk
          (value *__return_storage_ptr__,anon_unknown_46 *this,
          gc_heap_ptr<mjs::global_object> *global,value *reviver,object_ptr *holder,
          wstring_view name)

{
  pointer psVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  long *plVar5;
  object *this_00;
  uint *puVar6;
  value *extraout_RAX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  long lVar8;
  gc_heap *this_01;
  uint uVar9;
  mjs *this_02;
  initializer_list<mjs::value> __l;
  wstring is;
  vector<mjs::string,_std::allocator<mjs::string>_> keys;
  value val;
  value new_element;
  wstring_view in_stack_fffffffffffffec8;
  wstring_view local_128;
  undefined1 local_118 [8];
  undefined1 local_110 [8];
  undefined1 local_108 [24];
  vector<mjs::string,_std::allocator<mjs::string>_> local_f0;
  value *local_d8;
  gc_heap *local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [40];
  value *local_98;
  undefined1 local_90 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_88;
  value local_68;
  wstring_view local_40;
  
  local_d0 = *(gc_heap **)this;
  local_d8 = (value *)global;
  local_c0._32_8_ = __return_storage_ptr__;
  local_98 = reviver;
  local_40._M_len = (size_t)holder;
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver);
  (**(code **)*puVar4)(local_c8,puVar4,&local_40);
  if (local_c8._0_4_ == object) {
    bVar2 = is_array((object_ptr *)(local_c8 + 8));
    if (bVar2) {
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
      local_118 = (undefined1  [8])0x6;
      local_110 = (undefined1  [8])0x194e58;
      (**(code **)*puVar4)(local_90,puVar4);
      uVar3 = to_uint32((value *)local_90);
      value::destroy((value *)local_90);
      if (uVar3 != 0) {
        this_02 = (mjs *)0x0;
        uVar7 = extraout_RDX;
        do {
          index_string_abi_cxx11_((wstring *)local_118,this_02,(uint32_t)uVar7);
          json_walk((value *)local_90,this,(gc_heap_ptr<mjs::global_object> *)local_d8,
                    (value *)(local_c8 + 8),(object_ptr *)local_110,in_stack_fffffffffffffec8);
          if (local_90._0_4_ == undefined) {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
            local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_110;
            local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_118;
            (**(code **)(*plVar5 + 0x10))(plVar5,(gc_heap_ptr_untyped *)&local_f0);
          }
          else {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
            local_128._M_len = (size_t)local_110;
            local_128._M_str = (wchar_t *)local_118;
            string::string((string *)&local_f0,local_d0,&local_128);
            (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)&local_f0,(value *)local_90,0);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f0);
          }
          value::destroy((value *)local_90);
          uVar7 = extraout_RDX_00;
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,CONCAT44(local_108._4_4_,local_108._0_4_) * 4 + 4);
            uVar7 = extraout_RDX_01;
          }
          uVar9 = (int)this_02 + 1;
          this_02 = (mjs *)(ulong)uVar9;
        } while (uVar3 != uVar9);
      }
    }
    else {
      this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
      object::own_property_names(&local_f0,this_00,true);
      psVar1 = local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (gc_heap *)
                  local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_118 = (undefined1  [8])local_108;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)local_118,puVar6 + 1,puVar6 + (ulong)*puVar6 + 1);
          json_walk((value *)local_90,this,(gc_heap_ptr<mjs::global_object> *)local_d8,
                    (value *)(local_c8 + 8),(object_ptr *)local_110,in_stack_fffffffffffffec8);
          if (local_90._0_4_ == undefined) {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
            puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
            local_128._M_str = (wchar_t *)(puVar6 + 1);
            local_128._M_len = (size_t)*puVar6;
            (**(code **)(*plVar5 + 0x10))(plVar5,&local_128);
          }
          else {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c8 + 8));
            (**(code **)(*plVar5 + 8))(plVar5,this_01,(value *)local_90,0);
          }
          value::destroy((value *)local_90);
          if (local_118 != (undefined1  [8])local_108) {
            operator_delete((void *)local_118,CONCAT44(local_108._4_4_,local_108._0_4_) * 4 + 4);
          }
          this_01 = (gc_heap *)&this_01->alloc_context_;
        } while (this_01 != (gc_heap *)psVar1);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_f0);
    }
  }
  local_118._0_4_ = 5;
  local_110 = *(undefined1 (*) [8])local_98;
  local_108._0_4_ = *(undefined4 *)&local_98->field_1;
  if (local_110 != (undefined1  [8])0x0) {
    gc_heap::attach((gc_heap *)local_110,(gc_heap_ptr_untyped *)local_110);
  }
  string::string((string *)&local_128,local_d0,&local_40);
  local_90._0_4_ = string;
  local_88.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_128._M_len;
  local_88.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       (uint32_t)local_128._M_str;
  if ((gc_heap *)local_128._M_len != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_128._M_len,(gc_heap_ptr_untyped *)(local_90 + 8));
  }
  value::value((value *)(local_90 + 0x28),(value *)local_c8);
  __l._M_len = 2;
  __l._M_array = (iterator)local_90;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0,__l,
             (allocator_type *)&stack0xfffffffffffffed7);
  call_function((value *)local_c0._32_8_,local_d8,(value *)local_118,
                (vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0);
  lVar8 = 0x28;
  do {
    value::destroy((value *)(local_90 + lVar8));
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x28);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_128);
  value::destroy((value *)local_118);
  value::destroy((value *)local_c8);
  return extraout_RAX;
}

Assistant:

value json_walk(const gc_heap_ptr<global_object>& global, const value& reviver, const object_ptr& holder, const std::wstring_view name) {
    auto& h = global.heap();

    const auto val = holder->get(name);
    if (val.type() == value_type::object) {
        const auto& o = val.object_value();
        if (is_array(o)) {
            const uint32_t len = to_uint32(o->get(L"length"));
            for (uint32_t i = 0; i < len; ++i) {
                const auto is = index_string(i);
                auto new_element = json_walk(global, reviver, o, is);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(is);
                } else {
                    o->put(string{h, is}, new_element);
                }
            }
        } else {
            const auto keys = o->own_property_names(true);
            for (const auto& p: keys) {
                const std::wstring key{p.view()}; // Keep local copy in case p gets moved during the walk
                auto new_element = json_walk(global, reviver, o, key);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(p.view());
                } else {
                    o->put(p, new_element);
                }
            }
        }
    }
    return call_function(reviver, value{holder}, { value{string{h, name}}, val });
}